

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcDoorStyle::~IfcDoorStyle(IfcDoorStyle *this)

{
  IfcTypeProduct *this_00;
  char *pcVar1;
  long lVar2;
  undefined1 *puVar3;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcTypeProduct).super_IfcTypeObject + -0x18);
  this_00 = (IfcTypeProduct *)(&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x0 + lVar2);
  pcVar1 = (this->Sizeable).field_2._M_local_buf + lVar2;
  pcVar1[-0x1c8] = -0x80;
  pcVar1[-0x1c7] = '=';
  pcVar1[-0x1c6] = -0x6f;
  pcVar1[-0x1c5] = '\0';
  pcVar1[-0x1c4] = '\0';
  pcVar1[-0x1c3] = '\0';
  pcVar1[-0x1c2] = '\0';
  pcVar1[-0x1c1] = '\0';
  pcVar1[0x10] = 'H';
  pcVar1[0x11] = '>';
  pcVar1[0x12] = -0x6f;
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  pcVar1[-0x140] = -0x58;
  pcVar1[-0x13f] = '=';
  pcVar1[-0x13e] = -0x6f;
  pcVar1[-0x13d] = '\0';
  pcVar1[-0x13c] = '\0';
  pcVar1[-0x13b] = '\0';
  pcVar1[-0x13a] = '\0';
  pcVar1[-0x139] = '\0';
  pcVar1[-0x130] = -0x30;
  pcVar1[-0x12f] = '=';
  pcVar1[-0x12e] = -0x6f;
  pcVar1[-0x12d] = '\0';
  pcVar1[-300] = '\0';
  pcVar1[-299] = '\0';
  pcVar1[-0x12a] = '\0';
  pcVar1[-0x129] = '\0';
  pcVar1[-0xd8] = -8;
  pcVar1[-0xd7] = '=';
  pcVar1[-0xd6] = -0x6f;
  pcVar1[-0xd5] = '\0';
  pcVar1[-0xd4] = '\0';
  pcVar1[-0xd3] = '\0';
  pcVar1[-0xd2] = '\0';
  pcVar1[-0xd1] = '\0';
  pcVar1[-0x80] = ' ';
  pcVar1[-0x7f] = '>';
  pcVar1[-0x7e] = -0x6f;
  pcVar1[-0x7d] = '\0';
  pcVar1[-0x7c] = '\0';
  pcVar1[-0x7b] = '\0';
  pcVar1[-0x7a] = '\0';
  pcVar1[-0x79] = '\0';
  if (*(char **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(char **)(pcVar1 + -0x10));
  }
  puVar3 = *(undefined1 **)&this_00[1].super_IfcTypeObject.field_0x38;
  if (puVar3 != &this_00[1].super_IfcTypeObject.field_0x48) {
    operator_delete(puVar3);
  }
  puVar3 = *(undefined1 **)&this_00[1].super_IfcTypeObject.field_0x18;
  if (puVar3 != &this_00[1].super_IfcTypeObject.field_0x28) {
    operator_delete(puVar3);
  }
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__00913e60);
  operator_delete(this_00);
  return;
}

Assistant:

IfcDoorStyle() : Object("IfcDoorStyle") {}